

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoggingDemo.cpp
# Opt level: O0

int main(void)

{
  AbstractLoggingDevice *this;
  AbstractFormatter *pAVar1;
  FileLogger *this_00;
  ostream *poVar2;
  string local_438 [39];
  allocator local_411;
  string local_410 [39];
  allocator local_3e9;
  string local_3e8 [32];
  ostringstream local_3c8 [8];
  ostringstream __stream__unique___1;
  string local_248 [4];
  uint _lineNo_1;
  allocator local_221;
  string local_220 [39];
  allocator local_1f9;
  string local_1f8 [32];
  ostringstream local_1d8 [8];
  ostringstream __stream__unique__;
  uint _lineNo;
  char *c;
  double b;
  int a;
  undefined4 local_c;
  
  local_c = 0;
  this = (AbstractLoggingDevice *)operator_new(0x10);
  pAVar1 = (AbstractFormatter *)operator_new(0x10);
  SLogLib::NullFormatter::NullFormatter((NullFormatter *)pAVar1,No);
  SLogLib::ConsoleLogger::ConsoleLogger((ConsoleLogger *)this,pAVar1);
  SLogLib::addLoggingDevice(this);
  this_00 = (FileLogger *)operator_new(0x18);
  b._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&a,"foo.log",(allocator *)((long)&b + 7));
  pAVar1 = (AbstractFormatter *)operator_new(0x10);
  SLogLib::DetailedFormatter::DetailedFormatter((DetailedFormatter *)pAVar1,No);
  SLogLib::FileLogger::FileLogger(this_00,(string *)&a,_S_app,Immediately,pAVar1);
  b._6_1_ = 0;
  SLogLib::addLoggingDevice((AbstractLoggingDevice *)this_00);
  std::__cxx11::string::~string((string *)&a);
  std::allocator<char>::~allocator((allocator<char> *)((long)&b + 7));
  b._0_4_ = 10;
  std::__cxx11::ostringstream::ostringstream(local_1d8);
  poVar2 = std::operator<<((ostream *)local_1d8,"a = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,b._0_4_);
  poVar2 = std::operator<<(poVar2," b = ");
  std::ostream::operator<<(poVar2,15.3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1f8,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/saurabhg17[P]SLogLib/Examples/LoggingDemo/LoggingDemo.cpp"
             ,&local_1f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_220,"main",&local_221);
  std::__cxx11::ostringstream::str();
  SLogLib::writeMessage(local_1f8,local_220,0x16,Info,local_248);
  std::__cxx11::string::~string(local_248);
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::~allocator((allocator<char> *)&local_221);
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  std::__cxx11::ostringstream::~ostringstream(local_1d8);
  std::__cxx11::ostringstream::ostringstream(local_3c8);
  std::operator<<((ostream *)local_3c8,"Success");
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_3e8,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/saurabhg17[P]SLogLib/Examples/LoggingDemo/LoggingDemo.cpp"
             ,&local_3e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_410,"main",&local_411);
  std::__cxx11::ostringstream::str();
  SLogLib::writeMessage(local_3e8,local_410,0x17,Info,local_438);
  std::__cxx11::string::~string(local_438);
  std::__cxx11::string::~string(local_410);
  std::allocator<char>::~allocator((allocator<char> *)&local_411);
  std::__cxx11::string::~string(local_3e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3e9);
  std::__cxx11::ostringstream::~ostringstream(local_3c8);
  return 0;
}

Assistant:

int main()
{
	// Add these lines at the beginning of your program.
	// The devices and formatters are automatically deleted by SLogLib.
	using namespace SLogLib;
	addLoggingDevice(new ConsoleLogger(new NullFormatter));
	addLoggingDevice(new FileLogger("foo.log", std::ios_base::app, FileOpenFlag::Immediately, new DetailedFormatter));
	
	// The following line writes the message to both console and file.
	int a = 10;
	double b = 15.3;
	const char* c = "Success";
	SLOGLIB_LOG_MSG_INFO("a = " << a << " b = " << b);
	SLOGLIB_LOG_MSG_INFO(c);
	
	return 0;
}